

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

int deflateCopy(z_streamp dest,z_streamp source)

{
  internal_state *__src;
  internal_state *__dest;
  Bytef *pBVar1;
  Posf *pPVar2;
  long lVar3;
  int iVar4;
  z_streamp pzVar5;
  
  iVar4 = -2;
  if ((dest != (z_streamp)0x0 && source != (z_streamp)0x0) &&
     (__src = source->state, __src != (internal_state *)0x0)) {
    pzVar5 = dest;
    for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
      pzVar5->next_in = source->next_in;
      source = (z_streamp)&source->avail_in;
      pzVar5 = (z_streamp)&pzVar5->avail_in;
    }
    __dest = (internal_state *)(*dest->zalloc)(dest->opaque,1,0x1728);
    iVar4 = -4;
    if (__dest != (internal_state *)0x0) {
      dest->state = __dest;
      memcpy(__dest,__src,0x1728);
      __dest->strm = dest;
      pBVar1 = (Bytef *)(*dest->zalloc)(dest->opaque,__dest->w_size,2);
      __dest->window = pBVar1;
      pPVar2 = (Posf *)(*dest->zalloc)(dest->opaque,__dest->w_size,2);
      __dest->prev = pPVar2;
      pPVar2 = (Posf *)(*dest->zalloc)(dest->opaque,__dest->hash_size,2);
      __dest->head = pPVar2;
      pBVar1 = (Bytef *)(*dest->zalloc)(dest->opaque,__dest->lit_bufsize,4);
      __dest->pending_buf = pBVar1;
      if (((__dest->window == (Bytef *)0x0) || (__dest->prev == (Posf *)0x0)) ||
         (pBVar1 == (Bytef *)0x0 || __dest->head == (Posf *)0x0)) {
        deflateEnd(dest);
      }
      else {
        memcpy(__dest->window,__src->window,(ulong)(__dest->w_size * 2));
        memcpy(__dest->prev,__src->prev,(ulong)__dest->w_size * 2);
        memcpy(__dest->head,__src->head,(ulong)__dest->hash_size * 2);
        memcpy(__dest->pending_buf,__src->pending_buf,(ulong)(uint)__dest->pending_buf_size);
        __dest->pending_out =
             __dest->pending_buf + ((long)__src->pending_out - (long)__src->pending_buf);
        __dest->d_buf = (ushf *)(pBVar1 + (__dest->lit_bufsize & 0xfffffffe));
        __dest->l_buf = __dest->pending_buf + (ulong)__dest->lit_bufsize * 3;
        (__dest->l_desc).dyn_tree = __dest->dyn_ltree;
        (__dest->d_desc).dyn_tree = __dest->dyn_dtree;
        (__dest->bl_desc).dyn_tree = __dest->bl_tree;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int ZEXPORT deflateCopy (dest, source)
    z_streamp dest;
    z_streamp source;
{
#ifdef MAXSEG_64K
    return Z_STREAM_ERROR;
#else
    deflate_state *ds;
    deflate_state *ss;
    ushf *overlay;


    if (source == Z_NULL || dest == Z_NULL || source->state == Z_NULL) {
        return Z_STREAM_ERROR;
    }

    ss = source->state;

    zmemcpy(dest, source, sizeof(z_stream));

    ds = (deflate_state *) ZALLOC(dest, 1, sizeof(deflate_state));
    if (ds == Z_NULL) return Z_MEM_ERROR;
    dest->state = (struct internal_state FAR *) ds;
    zmemcpy(ds, ss, sizeof(deflate_state));
    ds->strm = dest;

    ds->window = (Bytef *) ZALLOC(dest, ds->w_size, 2*sizeof(Byte));
    ds->prev   = (Posf *)  ZALLOC(dest, ds->w_size, sizeof(Pos));
    ds->head   = (Posf *)  ZALLOC(dest, ds->hash_size, sizeof(Pos));
    overlay = (ushf *) ZALLOC(dest, ds->lit_bufsize, sizeof(ush)+2);
    ds->pending_buf = (uchf *) overlay;

    if (ds->window == Z_NULL || ds->prev == Z_NULL || ds->head == Z_NULL ||
        ds->pending_buf == Z_NULL) {
        deflateEnd (dest);
        return Z_MEM_ERROR;
    }
    /* following zmemcpy do not work for 16-bit MSDOS */
    zmemcpy(ds->window, ss->window, ds->w_size * 2 * sizeof(Byte));
    zmemcpy(ds->prev, ss->prev, ds->w_size * sizeof(Pos));
    zmemcpy(ds->head, ss->head, ds->hash_size * sizeof(Pos));
    zmemcpy(ds->pending_buf, ss->pending_buf, (uInt)ds->pending_buf_size);

    ds->pending_out = ds->pending_buf + (ss->pending_out - ss->pending_buf);
    ds->d_buf = overlay + ds->lit_bufsize/sizeof(ush);
    ds->l_buf = ds->pending_buf + (1+sizeof(ush))*ds->lit_bufsize;

    ds->l_desc.dyn_tree = ds->dyn_ltree;
    ds->d_desc.dyn_tree = ds->dyn_dtree;
    ds->bl_desc.dyn_tree = ds->bl_tree;

    return Z_OK;
#endif /* MAXSEG_64K */
}